

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>
::STDAllocator<unsigned_long>
          (STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>
           *this,STDAllocator<unsigned_long,_Diligent::IMemoryAllocator> *other)

{
  STDAllocator<unsigned_long,_Diligent::IMemoryAllocator> *other_local;
  STDAllocator<std::__detail::_Hash_node<unsigned_long,_false>,_Diligent::IMemoryAllocator>
  *this_local;
  
  this->m_Allocator = other->m_Allocator;
  this->m_dvpDescription = other->m_dvpDescription;
  this->m_dvpFileName = other->m_dvpFileName;
  this->m_dvpLineNumber = other->m_dvpLineNumber;
  return;
}

Assistant:

STDAllocator(const STDAllocator<U, AllocatorType>& other) noexcept :
        // clang-format off
        m_Allocator     {other.m_Allocator}
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{other.m_dvpDescription}
      , m_dvpFileName   {other.m_dvpFileName   }
      , m_dvpLineNumber {other.m_dvpLineNumber }
#endif
    // clang-format on
    {
    }